

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Performance::binaryOpFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numOperations,char *op)

{
  undefined4 in_register_00000014;
  char *local_98;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  int i;
  undefined1 local_21;
  char *local_20;
  char *op_local;
  string *psStack_10;
  int numOperations_local;
  string *resultTemplate;
  
  local_20 = (char *)CONCAT44(in_register_00000014,numOperations);
  op_local._4_4_ = (int)this;
  local_21 = 0;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "varying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tmediump vec4 value = ")
  ;
  for (local_38 = 0; local_38 < op_local._4_4_; local_38 = local_38 + 1) {
    if (local_38 < 1) {
      local_98 = "";
    }
    else {
      local_98 = local_20;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,local_98,&local_79);
    std::operator+(&local_58,&local_78,"v_value${NAME_SPEC}");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             ";\n\tgl_FragColor = value + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  return __return_storage_ptr__;
}

Assistant:

static string binaryOpFragmentTemplate (int numOperations, const char* op)
{
	string resultTemplate;

	resultTemplate +=
		"varying mediump vec4 v_value${NAME_SPEC};\n"
		"\n"
		"void main()\n"
		"{\n"
		"	mediump vec4 value = ";

	for (int i = 0; i < numOperations; i++)
		resultTemplate += string(i > 0 ? op : "") + "v_value${NAME_SPEC}";

	resultTemplate +=
		";\n"
		"	gl_FragColor = value + ${FLOAT01};\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}